

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::allocateTexture
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint levels)

{
  GLenum err;
  ostream *poVar1;
  GLsizei levels_00;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x88,"Allocate [levels: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,levels);
  std::operator<<(poVar1,"] - ");
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
            (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture);
  levels_00 = 1;
  if (target != 0x84f5) {
    levels_00 = levels;
  }
  (this->mState).levels = levels_00;
  gl4cts::Texture::Storage
            (gl,target,levels_00,format,(this->mState).width,(this->mState).height,
             (this->mState).depth);
  err = (*gl->getError)();
  glu::checkError(err,"TexStorage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0x780);
  return true;
}

Assistant:

bool SparseTextureCommitmentTestCase::allocateTexture(const Functions& gl, GLint target, GLint format, GLuint& texture,
													  GLint levels)
{
	mLog << "Allocate [levels: " << levels << "] - ";

	prepareTexture(gl, target, format, texture);

	//GL_TEXTURE_RECTANGLE can have only one level
	if (target != GL_TEXTURE_RECTANGLE)
		mState.levels = levels;
	else
		mState.levels = 1;

	Texture::Storage(gl, target, mState.levels, format, mState.width, mState.height, mState.depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage");

	return true;
}